

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O0

uint32_t __thiscall
basis_file::transcodeImage
          (basis_file *this,void *dst,uint32_t dst_size,uint32_t image_index,uint32_t level_index,
          uint32_t format,uint32_t param_7,uint32_t get_alpha_for_opaque_formats)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  uint *puVar4;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  uint in_R8D;
  transcoder_texture_format in_R9D;
  int in_stack_00000010;
  uint32_t height;
  uint32_t width;
  uint32_t required_size;
  uint32_t bytes_per_block;
  uint32_t bytes_per_slice;
  uint32_t bytes_per_line;
  uint32_t bytes_per_pixel;
  uint32_t status;
  uint32_t flags;
  uint32_t total_blocks;
  uint32_t orig_height;
  uint32_t orig_width;
  transcoder_texture_format transcoder_format;
  uint in_stack_ffffffffffffff54;
  uint local_7c [3];
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  transcoder_texture_format local_44;
  transcoder_texture_format local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint32_t local_1c;
  
  if (*in_RDI != -0x2152411f) {
    __assert_fail("m_magic == MAGIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                  ,0xa0,
                  "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  if (*in_RDI == -0x2152411f) {
    if (in_R9D < cTFTotalTextureFormats) {
      local_44 = in_R9D;
      local_40 = in_R9D;
      local_3c = in_R8D;
      local_38 = in_ECX;
      local_34 = in_EDX;
      local_30 = in_ESI;
      uVar3 = basist::basisu_transcoder::get_image_level_desc
                        (in_RDI + 2,(uint)*(undefined8 *)(in_RDI + 200),in_RDI[0xca],in_ECX,
                         (uint *)(ulong)in_R8D,&local_48,&local_4c);
      if ((uVar3 & 1) == 0) {
        local_1c = 0;
      }
      else {
        local_54 = 0;
        if (in_stack_00000010 != 0) {
          local_54 = 4;
        }
        uVar3 = basist::basis_transcoder_format_is_uncompressed(local_44);
        if ((uVar3 & 1) == 0) {
          local_68 = basist::basis_get_bytes_per_block_or_pixel(local_44);
          local_6c = local_50 * local_68;
          if ((local_44 == cTFPVRTC1_4_RGB) || (local_44 == cTFPVRTC1_4_RGBA)) {
            local_70 = local_48 + 3 & 0xfffffffc;
            local_7c[2] = local_4c + 3 & 0xfffffffc;
            local_7c[1] = 8;
            puVar4 = std::max<unsigned_int>(local_7c + 1,&local_70);
            uVar1 = *puVar4;
            local_7c[0] = 8;
            puVar4 = std::max<unsigned_int>(local_7c,local_7c + 2);
            local_6c = uVar1 * *puVar4 * 4 + 7 >> 3;
            if (local_6c < local_50 * local_68) {
              __assert_fail("required_size >= total_blocks * bytes_per_block",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                            ,0xd0,
                            "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                           );
            }
          }
          if (local_34 < local_6c) {
            __assert_fail("required_size <= dst_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                          ,0xd3,
                          "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                         );
          }
          bVar2 = basist::basisu_transcoder::transcode_image_level
                            (in_RDI + 2,(uint)*(undefined8 *)(in_RDI + 200),in_RDI[0xca],local_38,
                             (void *)(ulong)local_3c,local_30,local_34 / local_68,local_40,local_54,
                             (basisu_transcoder_state *)((ulong)in_stack_ffffffffffffff54 << 0x20),0
                            );
        }
        else {
          local_5c = basist::basis_get_uncompressed_bytes_per_pixel(local_44);
          local_60 = local_48 * local_5c;
          local_64 = local_60 * local_4c;
          if (local_34 < local_64) {
            __assert_fail("bytes_per_slice <= dst_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                          ,0xb7,
                          "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                         );
          }
          bVar2 = basist::basisu_transcoder::transcode_image_level
                            (in_RDI + 2,(uint)*(undefined8 *)(in_RDI + 200),in_RDI[0xca],local_38,
                             (void *)(ulong)local_3c,local_30,local_48 * local_4c,local_44,local_54,
                             (basisu_transcoder_state *)CONCAT44(in_stack_ffffffffffffff54,local_48)
                             ,0);
        }
        local_58 = (uint)(bVar2 & 1);
        local_1c = local_58;
      }
    }
    else {
      local_1c = 0;
    }
  }
  else {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

uint32_t basis_file::transcodeImage(void* dst, uint32_t dst_size, uint32_t image_index, uint32_t level_index, uint32_t format, uint32_t /*pvrtc_wrap_addressing*/, uint32_t get_alpha_for_opaque_formats) {
    assert(m_magic == MAGIC);
    if (m_magic != MAGIC)
        return 0;

    if (format >= (uint32_t) basist::transcoder_texture_format::cTFTotalTextureFormats)
        return 0;

    const transcoder_texture_format transcoder_format = static_cast<transcoder_texture_format>(format);

    uint32_t orig_width, orig_height, total_blocks;
    if (!m_transcoder.get_image_level_desc(m_file, byteLength, image_index, level_index, orig_width, orig_height, total_blocks))
        return 0;

    uint32_t flags = get_alpha_for_opaque_formats ? cDecodeFlagsTranscodeAlphaDataToOpaqueFormats : 0;

    uint32_t status;

    if (basis_transcoder_format_is_uncompressed(transcoder_format))
    {
        MAYBE_UNUSED const uint32_t bytes_per_pixel = basis_get_uncompressed_bytes_per_pixel(transcoder_format);
        MAYBE_UNUSED const uint32_t bytes_per_line = orig_width * bytes_per_pixel;
        MAYBE_UNUSED const uint32_t bytes_per_slice = bytes_per_line * orig_height;

        assert(bytes_per_slice <= dst_size);

        status = m_transcoder.transcode_image_level(
            m_file, byteLength, image_index, level_index,
            dst, orig_width * orig_height,
            transcoder_format,
            flags,
            orig_width,
            nullptr,
            orig_height);
    }
    else
    {
        uint32_t bytes_per_block = basis_get_bytes_per_block_or_pixel(transcoder_format);

        MAYBE_UNUSED uint32_t required_size = total_blocks * bytes_per_block;

        if (transcoder_format == transcoder_texture_format::cTFPVRTC1_4_RGB || transcoder_format == transcoder_texture_format::cTFPVRTC1_4_RGBA)
        {
            // For PVRTC1, Basis only writes (or requires) total_blocks * bytes_per_block. But GL requires extra padding for very small textures: 
            // https://www.khronos.org/registry/OpenGL/extensions/IMG/IMG_texture_compression_pvrtc.txt
            // The transcoder will clear the extra bytes followed the used blocks to 0.
            const uint32_t width = (orig_width + 3) & ~3;
            const uint32_t height = (orig_height + 3) & ~3;
            required_size = (std::max(8U, width) * std::max(8U, height) * 4 + 7) / 8;
            assert(required_size >= total_blocks * bytes_per_block);
        }

        assert(required_size <= dst_size);

        status = m_transcoder.transcode_image_level(
            m_file, byteLength, image_index, level_index,
            dst, dst_size / bytes_per_block,
            static_cast<basist::transcoder_texture_format>(format),
            flags);
    }

    return status;
}